

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Config.cpp
# Opt level: O3

bool Config::parse(int argc,char **argv,List<Path> *rcFiles)

{
  Type TVar1;
  pointer pSVar2;
  undefined1 this [8];
  char **ppcVar3;
  option *poVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  pointer pPVar8;
  FILE *__stream;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  EVP_PKEY_CTX *src_02;
  byte bVar12;
  pointer pSVar13;
  option *poVar14;
  pointer ppOVar15;
  pointer ppOVar16;
  long lVar17;
  char *pcVar18;
  ulong uVar19;
  long lVar20;
  long *plVar21;
  bool ok;
  List<String> args;
  int idx;
  List<String> split;
  List<Config::OptionBase_*> optionPointers;
  List<Value> vals;
  String error;
  String shortOpts;
  Value val;
  char line [1024];
  bool local_15c9;
  vector<String,_std::allocator<String>_> local_15c8;
  int local_15a4;
  undefined1 local_15a0 [8];
  undefined1 local_1598 [48];
  void *local_1568;
  iterator iStack_1560;
  OptionBase **local_1558;
  vector<Value,_std::allocator<Value>_> local_1548;
  uint local_1524;
  List<Path> *local_1520;
  undefined1 *local_1518;
  long local_1510;
  undefined1 local_1508 [16];
  char **local_14f8;
  ulong local_14f0;
  String local_14e8;
  Value local_14c8;
  Value local_1490;
  String local_1458 [32];
  String *local_1058;
  undefined8 local_1050;
  option local_1048 [128];
  option *local_48;
  ulong local_40;
  
  local_1518 = local_1508;
  local_1510 = 0;
  local_1508[0] = 0;
  local_1520 = rcFiles;
  Rct::findExecutablePath(*argv);
  local_15c8.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_15c8.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_15c8.super__Vector_base<String,_std::allocator<String>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  String::String((String *)local_1048,*argv,0xffffffffffffffff);
  local_1524 = argc;
  std::vector<String,_std::allocator<String>_>::push_back(&local_15c8,(value_type *)local_1048);
  local_14f8 = argv;
  if ((int **)local_1048[0].name != &local_1048[0].flag) {
    operator_delete(local_1048[0].name);
  }
  pPVar8 = (local_1520->super_vector<Path,_std::allocator<Path>_>).
           super__Vector_base<Path,_std::allocator<Path>_>._M_impl.super__Vector_impl_data._M_start;
  if ((local_1520->super_vector<Path,_std::allocator<Path>_>).
      super__Vector_base<Path,_std::allocator<Path>_>._M_impl.super__Vector_impl_data._M_finish !=
      pPVar8) {
    uVar11 = 0;
    do {
      local_14f0 = uVar11;
      __stream = fopen(pPVar8[uVar11].super_String.mString._M_dataplus._M_p,"r");
      if (__stream != (FILE *)0x0) {
        while (iVar7 = Rct::readLine((FILE *)__stream,(char *)local_1048,0x400), iVar7 != -1) {
          pcVar18 = (char *)((long)&local_1050 + 7);
          do {
            cVar6 = pcVar18[1];
            pcVar18 = pcVar18 + 1;
            iVar7 = isspace((int)cVar6);
          } while (iVar7 != 0);
          if (cVar6 != '#') {
            String::String(local_1458,pcVar18,0xffffffffffffffff);
            String::split((List<String> *)local_15a0,local_1458,' ',0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_1458[0].mString._M_dataplus._M_p._1_7_,
                            local_1458[0].mString._M_dataplus._M_p._0_1_) !=
                &local_1458[0].mString.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_1458[0].mString._M_dataplus._M_p._1_7_,
                                       local_1458[0].mString._M_dataplus._M_p._0_1_));
            }
            this = local_15a0;
            if (local_15a0 != (undefined1  [8])CONCAT71(local_1598._1_7_,local_1598[0])) {
              if ((*(ulong *)((long)local_15a0 + 8) == 1) ||
                 ((2 < *(ulong *)((long)local_15a0 + 8) &&
                  (*(char *)(*(long *)local_15a0 + 1) == '=')))) {
                local_1458[0].mString._M_dataplus._M_p._0_1_ = 0x2d;
                std::__cxx11::string::replace((ulong)local_15a0,0,(char *)0x0,(ulong)local_1458);
              }
              else {
                String::String(local_1458,"--",0xffffffffffffffff);
                String::prepend((String *)this,local_1458);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_1458[0].mString._M_dataplus._M_p._1_7_,
                                local_1458[0].mString._M_dataplus._M_p._0_1_) !=
                    &local_1458[0].mString.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT71(local_1458[0].mString._M_dataplus._M_p._1_7_,
                                           local_1458[0].mString._M_dataplus._M_p._0_1_));
                }
              }
              List<String>::append((List<String> *)&local_15c8,(List<String> *)local_15a0);
            }
            std::vector<String,_std::allocator<String>_>::~vector
                      ((vector<String,_std::allocator<String>_> *)local_15a0);
          }
        }
        fclose(__stream);
      }
      uVar11 = local_14f0 + 1;
      pPVar8 = (local_1520->super_vector<Path,_std::allocator<Path>_>).
               super__Vector_base<Path,_std::allocator<Path>_>._M_impl.super__Vector_impl_data.
               _M_start;
    } while (uVar11 < (ulong)((long)(local_1520->super_vector<Path,_std::allocator<Path>_>).
                                    super__Vector_base<Path,_std::allocator<Path>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)pPVar8 >> 5));
  }
  ppcVar3 = local_14f8;
  if (1 < (int)local_1524) {
    uVar19 = (ulong)local_1524;
    uVar11 = 1;
    do {
      String::String((String *)local_1048,ppcVar3[uVar11],0xffffffffffffffff);
      std::vector<String,_std::allocator<String>_>::emplace_back<String>
                (&local_15c8,(String *)local_1048);
      if ((int **)local_1048[0].name != &local_1048[0].flag) {
        operator_delete(local_1048[0].name);
      }
      uVar11 = uVar11 + 1;
    } while (uVar19 != uVar11);
  }
  pSVar2 = local_15c8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pSVar13 = local_15c8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1050 = (long)local_15c8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_15c8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                     super__Vector_impl_data._M_start >> 5;
  if (local_1050 < 0x81) {
    local_1058 = local_1458;
  }
  else {
    local_1058 = (String *)
                 operator_new__(-(ulong)(local_1050 >> 0x3d != 0) |
                                (long)local_15c8.super__Vector_base<String,_std::allocator<String>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_15c8.super__Vector_base<String,_std::allocator<String>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 2);
  }
  if (pSVar2 != pSVar13) {
    lVar17 = 0;
    lVar20 = 0;
    uVar11 = 0;
    do {
      pcVar18 = strdup(*(char **)((long)&(pSVar13->mString)._M_dataplus._M_p + lVar20));
      *(char **)((long)&(local_1058->mString)._M_dataplus._M_p + (lVar17 >> 0x1d)) = pcVar18;
      uVar11 = uVar11 + 1;
      lVar20 = lVar20 + 0x20;
      lVar17 = lVar17 + 0x100000000;
      pSVar13 = local_15c8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar11 < (ulong)((long)local_15c8.super__Vector_base<String,_std::allocator<String>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_15c8.super__Vector_base<String,_std::allocator<String>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 5));
  }
  ppOVar16 = sOptions.super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
             super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>._M_impl
             .super__Vector_impl_data._M_finish;
  ppOVar15 = sOptions.super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
             super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>._M_impl
             .super__Vector_impl_data._M_start;
  local_40 = ((long)sOptions.
                    super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                    super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)sOptions.
                    super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                    super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 3) + 1;
  local_48 = local_1048;
  if (0x80 < local_40) {
    local_48 = (option *)operator_new__(-(ulong)(local_40 >> 0x3b != 0) | local_40 * 0x20);
  }
  local_1568 = (void *)0x0;
  iStack_1560._M_current = (OptionBase **)0x0;
  local_1558 = (OptionBase **)0x0;
  if (ppOVar16 == ppOVar15) {
    lVar17 = 0;
  }
  else {
    uVar11 = 0;
    do {
      local_15a0 = (undefined1  [8])ppOVar15[uVar11];
      if (*(long *)((long)local_15a0 + 8) != 0) {
        poVar14 = local_48 + (int)((ulong)((long)iStack_1560._M_current - (long)local_1568) >> 3);
        if (iStack_1560._M_current == local_1558) {
          std::vector<Config::OptionBase*,std::allocator<Config::OptionBase*>>::
          _M_realloc_insert<Config::OptionBase*const&>
                    ((vector<Config::OptionBase*,std::allocator<Config::OptionBase*>> *)&local_1568,
                     iStack_1560,(OptionBase **)local_15a0);
        }
        else {
          *iStack_1560._M_current = (OptionBase *)local_15a0;
          iStack_1560._M_current = iStack_1560._M_current + 1;
        }
        poVar14->name = *(char **)((long)local_15a0 + 8);
        poVar14->has_arg = (uint)(*(int *)((long)local_15a0 + 0x38) != 2);
        poVar14->val = (int)(char)*(OptionBase *)((long)local_15a0 + 0x10);
        poVar14->flag = (int *)0x0;
        ppOVar15 = sOptions.
                   super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                   super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppOVar16 = sOptions.
                   super_vector<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                   super__Vector_base<Config::OptionBase_*,_std::allocator<Config::OptionBase_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < (ulong)((long)ppOVar16 - (long)ppOVar15 >> 3));
    lVar17 = (long)(int)((ulong)((long)iStack_1560._M_current - (long)local_1568) >> 3);
  }
  poVar4 = local_48;
  poVar14 = local_48 + lVar17;
  poVar14->flag = (int *)0x0;
  (&poVar14->flag)[1] = (int *)0x0;
  poVar4[lVar17].name = (char *)0x0;
  *(undefined8 *)&poVar4[lVar17].has_arg = 0;
  Rct::shortOptions(&local_14e8,local_48);
  local_15c9 = true;
  do {
    local_15a4 = -1;
    iVar7 = getopt_long((ulong)((long)local_15c8.super__Vector_base<String,_std::allocator<String>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_15c8.super__Vector_base<String,_std::allocator<String>_>.
                                     _M_impl.super__Vector_impl_data._M_start) >> 5,local_1058,
                        local_14e8.mString._M_dataplus._M_p,local_48,&local_15a4);
    if (iVar7 == -1) goto LAB_0013faaa;
    if (iVar7 == 0x3f) {
      local_15c9 = false;
      goto LAB_0013faaa;
    }
    if ((long)local_15a4 == -1) {
      if ((long)iStack_1560._M_current - (long)local_1568 == 0) goto LAB_0013fa9e;
      lVar17 = (long)iStack_1560._M_current - (long)local_1568 >> 3;
      lVar20 = 0;
      while (plVar21 = *(long **)((long)local_1568 + lVar20 * 8), iVar7 != (char)plVar21[2]) {
        lVar20 = lVar20 + 1;
        if (lVar17 + (ulong)(lVar17 == 0) == lVar20) goto LAB_0013fa9e;
      }
    }
    else {
      plVar21 = *(long **)((long)local_1568 + (long)local_15a4 * 8);
      if (plVar21 == (long *)0x0) {
LAB_0013fa9e:
        local_15c9 = false;
        goto LAB_0013faaa;
      }
    }
    plVar21[0x16] = plVar21[0x16] + 1;
    pcVar18 = _optarg;
    if (_optarg == (char *)0x0) {
      if ((int)plVar21[7] != 2) {
        __assert_fail("opt->defaultValue.type() == Value::Type_Boolean",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Config.cpp"
                      ,0x99,"static bool Config::parse(int, char **, const List<Path> &)");
      }
      bVar5 = Value::convert<bool>((Value *)(plVar21 + 7),(bool *)0x0);
      local_1598[0] = !bVar5;
      local_15a0._0_4_ = 2;
      Value::clear((Value *)(plVar21 + 0xe));
      Value::copy((Value *)(plVar21 + 0xe),(EVP_PKEY_CTX *)local_15a0,src_00);
      Value::clear((Value *)local_15a0);
LAB_0013fa8a:
      bVar12 = 0;
    }
    else {
      local_1490.mType = Type_Invalid;
      if (*_optarg == '=') {
        iVar7 = strcmp(*(char **)((long)local_1058 + (long)_optind * 8 + -8),_optarg);
        pcVar18 = pcVar18 + (iVar7 != 0);
      }
      TVar1 = *(Type *)(plVar21 + 0x15);
      local_15a0._0_4_ = 5;
      sVar9 = strlen(pcVar18);
      String::String((String *)local_1598,pcVar18,(long)(int)sVar9);
      Value::convert(&local_14c8,(Value *)local_15a0,TVar1,&local_15c9);
      Value::clear((Value *)local_15a0);
      Value::clear(&local_1490);
      Value::copy(&local_1490,(EVP_PKEY_CTX *)&local_14c8,src);
      Value::clear(&local_14c8);
      if (local_15c9 == false) {
        pcVar10 = "";
        if ((ulong)*(uint *)(plVar21 + 0x15) < 10) {
          pcVar10 = (&PTR_anon_var_dwarf_17b67_0018ffd0)[*(uint *)(plVar21 + 0x15)];
        }
        String::format<128ul>
                  ((String *)local_15a0,"\"%s\" can not be converted to \"%s\" for %s",pcVar18,
                   pcVar10,plVar21[1]);
        std::__cxx11::string::operator=((string *)&local_1518,(string *)local_15a0);
        if (local_15a0 != (undefined1  [8])(local_1598 + 8)) {
          operator_delete((void *)local_15a0);
        }
LAB_0013fa75:
        bVar12 = 0x15;
        bVar5 = false;
      }
      else {
        if ((int)plVar21[7] == 8) {
          local_1548.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_1548.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_1548.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::vector<Value,_std::allocator<Value>_>::push_back(&local_1548,&local_1490);
          uVar11 = (ulong)_optind;
          while (((uVar11 < (ulong)((long)local_15c8.
                                          super__Vector_base<String,_std::allocator<String>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_15c8.
                                          super__Vector_base<String,_std::allocator<String>_>.
                                          _M_impl.super__Vector_impl_data._M_start >> 5) &&
                  (pcVar18 = (&(local_1058->mString)._M_dataplus)[uVar11]._M_p, *pcVar18 != '-')) &&
                 ((plVar21[0x17] == 0 ||
                  ((ulong)(((long)local_1548.super__Vector_base<Value,_std::allocator<Value>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1548.super__Vector_base<Value,_std::allocator<Value>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x6db6db6db6db6db7) < (ulong)plVar21[0x17]))))) {
            TVar1 = *(Type *)(plVar21 + 0x15);
            local_15a0._0_4_ = 5;
            sVar9 = strlen(pcVar18);
            String::String((String *)local_1598,pcVar18,(long)(int)sVar9);
            Value::convert(&local_14c8,(Value *)local_15a0,TVar1,&local_15c9);
            Value::clear((Value *)local_15a0);
            std::vector<Value,_std::allocator<Value>_>::push_back(&local_1548,&local_14c8);
            Value::clear(&local_14c8);
            if (local_15c9 == false) {
              pcVar18 = "";
              if ((ulong)*(uint *)(plVar21 + 0x15) < 10) {
                pcVar18 = (&PTR_anon_var_dwarf_17b67_0018ffd0)[*(uint *)(plVar21 + 0x15)];
              }
              String::format<128ul>
                        ((String *)local_15a0,"\"%s\" can not be converted to \"%s\" for %s",
                         (&(local_1058->mString)._M_dataplus)[_optind]._M_p,pcVar18,plVar21[1]);
              goto LAB_0013fa44;
            }
            uVar11 = (long)_optind + 1;
            _optind = (int)uVar11;
          }
          local_15a0._0_4_ = 8;
          std::vector<Value,_std::allocator<Value>_>::vector
                    ((vector<Value,_std::allocator<Value>_> *)local_1598,&local_1548);
          Value::clear((Value *)(plVar21 + 0xe));
          Value::copy((Value *)(plVar21 + 0xe),(EVP_PKEY_CTX *)local_15a0,src_02);
          Value::clear((Value *)local_15a0);
          if ((plVar21[0x17] != 0) &&
             (((long)local_1548.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1548.super__Vector_base<Value,_std::allocator<Value>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7 - plVar21[0x17] !=
              0)) {
            local_15c9 = false;
            String::format<128ul>
                      ((String *)local_15a0,"Too few values specified for %s. Wanted %zu, got %zu",
                       plVar21[1]);
LAB_0013fa44:
            std::__cxx11::string::operator=((string *)&local_1518,(string *)local_15a0);
            if (local_15a0 != (undefined1  [8])(local_1598 + 8)) {
              operator_delete((void *)local_15a0);
            }
            std::vector<Value,_std::allocator<Value>_>::~vector(&local_1548);
            goto LAB_0013fa75;
          }
          std::vector<Value,_std::allocator<Value>_>::~vector(&local_1548);
        }
        else {
          Value::clear((Value *)(plVar21 + 0xe));
          Value::copy((Value *)(plVar21 + 0xe),(EVP_PKEY_CTX *)&local_1490,src_01);
        }
        cVar6 = (**(code **)(*plVar21 + 0x10))(plVar21,&local_1518);
        if (cVar6 == '\0') {
          local_15c9 = false;
          goto LAB_0013fa75;
        }
        bVar12 = 0;
        bVar5 = true;
      }
      Value::clear(&local_1490);
      if (bVar5) goto LAB_0013fa8a;
    }
  } while (bVar12 == 0);
  if (bVar12 == 0x15) {
LAB_0013faaa:
    uVar11 = (ulong)_optind;
    if (uVar11 < (ulong)((long)local_15c8.super__Vector_base<String,_std::allocator<String>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_15c8.super__Vector_base<String,_std::allocator<String>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 5)) {
      do {
        _optind = _optind + 1;
        pcVar18 = (&(local_1058->mString)._M_dataplus)[uVar11]._M_p;
        local_15a0._0_4_ = 5;
        sVar9 = strlen(pcVar18);
        String::String((String *)local_1598,pcVar18,(long)(int)sVar9);
        std::vector<Value,_std::allocator<Value>_>::push_back
                  (&sFreeArgs.super_vector<Value,_std::allocator<Value>_>,(Value *)local_15a0);
        Value::clear((Value *)local_15a0);
        uVar11 = (ulong)_optind;
      } while (uVar11 < (ulong)((long)local_15c8.super__Vector_base<String,_std::allocator<String>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_15c8.super__Vector_base<String,_std::allocator<String>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if ((sAllowsFreeArgs == false) &&
       (sFreeArgs.super_vector<Value,_std::allocator<Value>_>.
        super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data._M_start
        != sFreeArgs.super_vector<Value,_std::allocator<Value>_>.
           super__Vector_base<Value,_std::allocator<Value>_>._M_impl.super__Vector_impl_data.
           _M_finish)) {
      String::format<128ul>((String *)local_15a0,"Unexpected free args");
      std::__cxx11::string::operator=((string *)&local_1518,(string *)local_15a0);
      if (local_15a0 != (undefined1  [8])(local_1598 + 8)) {
        operator_delete((void *)local_15a0);
      }
      local_15c9 = false;
    }
    if (local_15c8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        local_15c8.super__Vector_base<String,_std::allocator<String>_>._M_impl.
        super__Vector_impl_data._M_start) {
      lVar17 = 0;
      uVar11 = 0;
      do {
        free(*(void **)((long)&(local_1058->mString)._M_dataplus._M_p + (lVar17 >> 0x1d)));
        uVar11 = uVar11 + 1;
        lVar17 = lVar17 + 0x100000000;
      } while (uVar11 < (ulong)((long)local_15c8.super__Vector_base<String,_std::allocator<String>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_15c8.super__Vector_base<String,_std::allocator<String>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    bVar12 = local_15c9;
    if ((local_15c9 == false) && (local_1510 != 0)) {
      showHelp((FILE *)_stderr);
      fprintf(_stderr,"%s\n",local_1518);
      bVar12 = local_15c9;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14e8.mString._M_dataplus._M_p != &local_14e8.mString.field_2) {
    operator_delete(local_14e8.mString._M_dataplus._M_p);
  }
  if (local_1568 != (void *)0x0) {
    operator_delete(local_1568);
  }
  if ((0x80 < local_40) && (local_48 != (option *)0x0)) {
    operator_delete__(local_48);
  }
  if ((0x80 < local_1050) && (local_1058 != (String *)0x0)) {
    operator_delete__(local_1058);
  }
  std::vector<String,_std::allocator<String>_>::~vector(&local_15c8);
  if (local_1518 != local_1508) {
    operator_delete(local_1518);
  }
  return (bool)(bVar12 & 1);
}

Assistant:

bool Config::parse(int argc, char **argv, const List<Path> &rcFiles)
{
    String error;
    Rct::findExecutablePath(argv[0]);
    List<String> args;
    args << argv[0];
    for (size_t i=0; i<rcFiles.size(); ++i) {
        FILE *f = fopen(rcFiles.at(i).constData(), "r");
        if (f) {
            char line[1024];
            int read;
            while ((read = Rct::readLine(f, line, sizeof(line))) != -1) {
                char *ch = line;
                while (isspace(*ch))
                    ++ch;
                if (*ch == '#')
                    continue;
                List<String> split = String(ch).split(' '); // ### quoting?
                if (!split.isEmpty()) {
                    String &first = split.first();
                    if (first.size() == 1 || (first.size() > 2 && first.at(1) == '=')) {
                        first.prepend('-');
                    } else {
                        first.prepend("--");
                    }
                    args += split;
                }
            }
            fclose(f);
        }
    }
    for (int i=1; i<argc; ++i)
        args.append(argv[i]);

    // ::error() << "parsing" << args;

    StackBuffer<128, char *> a(args.size());
    for (size_t i=0; i<args.size(); ++i) {
        a[i] = strdup(args.at(i).constData());
    }
    StackBuffer<128, option> options(sOptions.size() + 1);

    List<OptionBase*> optionPointers;
    for (size_t i=0; i<sOptions.size(); ++i) {
        OptionBase *opt = sOptions.at(i);
        if (opt->name) {
            option &o = options[optionPointers.size()];
            optionPointers.append(opt);
            o.name = opt->name;
            o.has_arg = (opt->defaultValue.type() == Value::Type_Boolean) ? no_argument : required_argument; // ### no optional arg?
            o.val = opt->shortOption;
            o.flag = 0;
        }
    }
    memset(&options[optionPointers.size()], 0, sizeof(option));
    const String shortOpts = Rct::shortOptions(options);

    bool ok = true;

    while (true) {
        int idx = -1;
        const int ret = getopt_long(args.size(), a, shortOpts.constData(), options, &idx);
        switch (ret) {
        case -1:
            goto done;
        case '?':
            ok = false;
            goto done;
        default:
            break;
        }
        // error() << optind << ret << optarg;
        // error("%c [%s] [%s]", ret, optarg, a[optind]);

        OptionBase *opt = 0;
        if (idx != -1) {
            opt = optionPointers[idx];
        } else {
            for (size_t i=0; i<optionPointers.size(); ++i) {
                if (optionPointers[i]->shortOption == ret) {
                    opt = optionPointers[i];
                    break;
                }
            }
        }
        if (!opt) {
            ok = false;
            goto done;
        }
        ++opt->count;
        if (optarg) {
            Value val;
            const char *arg = optarg;
            if (optarg[0] == '=' && strcmp(a[optind - 1], optarg)) {
                ++arg;
            }
            val = createValue(opt->type, arg, &ok);
            if (!ok) {
                error = String::format<128>("\"%s\" can not be converted to \"%s\" for %s",
                                            arg, Value::typeToString(opt->type),
                                            opt->name);
                goto done;
            }

            if (opt->defaultValue.type() == Value::Type_List) {
                List<Value> vals;
                vals << val;
                while (static_cast<size_t>(optind) < args.size() && a[optind][0] != '-' && (!opt->listCount || vals.size() < opt->listCount)) {
                    vals << createValue(opt->type, a[optind], &ok);
                    if (!ok) {
                        error = String::format<128>("\"%s\" can not be converted to \"%s\" for %s",
                                                    a[optind], Value::typeToString(opt->type),
                                                    opt->name);
                        goto done;
                    }
                    ++optind;
                }
                opt->value = vals;
                if (opt->listCount && vals.size() != opt->listCount) {
                    ok = false;
#ifdef _WIN32
                    error = String::format<128>("Too few values specified for %s. Wanted %Iu, got %Iu",
#else
                    error = String::format<128>("Too few values specified for %s. Wanted %zu, got %zu",
#endif

                                                opt->name, opt->listCount, vals.size());

                    goto done;
                }
            } else {
                opt->value = val;
            }
            if (!opt->validate(error)) {
                ok = false;
                goto done;
            }
        } else {
            assert(opt->defaultValue.type() == Value::Type_Boolean);
            // must be a toggle arg
            opt->value = Value(!opt->defaultValue.toBool());
        }
    }

done:
    while (static_cast<size_t>(optind) < args.size()) {
        sFreeArgs << a[optind++];
    }
    if (!sAllowsFreeArgs && !sFreeArgs.isEmpty()) {
        error = String::format<128>("Unexpected free args");
        ok = false;
    }

    for (size_t i=0; i<args.size(); ++i) {
        free(a[i]);
    }

    if (!ok) {
        if (!error.isEmpty()) {
            showHelp(stderr);
            fprintf(stderr, "%s\n", error.constData());
        }
    }
    return ok;
}